

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDASetEtaLow(void *ida_mem,sunrealtype eta_low)

{
  long in_RDI;
  double in_XMM0_Qa;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x98,"IDASetEtaLow",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    if ((in_XMM0_Qa <= 0.0) || (1.0 <= in_XMM0_Qa)) {
      *(undefined8 *)(in_RDI + 0x5a0) = 0x3feccccccccccccd;
    }
    else {
      *(double *)(in_RDI + 0x5a0) = in_XMM0_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetEtaLow(void* ida_mem, sunrealtype eta_low)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* set allowed value or use default */
  if (eta_low <= ZERO || eta_low >= ONE)
  {
    IDA_mem->ida_eta_low = ETA_LOW_DEFAULT;
  }
  else { IDA_mem->ida_eta_low = eta_low; }

  return (IDA_SUCCESS);
}